

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

string * google::protobuf::internal::StringTypeHandler::New(Arena *arena,string *value)

{
  ArenaImpl *in_RSI;
  size_t in_RDI;
  size_t n;
  type_info *in_stack_ffffffffffffff58;
  ArenaImpl *this;
  ArenaImpl *cleanup;
  size_t n_00;
  ArenaImpl *this_00;
  undefined8 local_40;
  
  if (in_RDI == 0) {
    local_40 = (string *)operator_new(0x20);
    std::__cxx11::string::string((string *)local_40,(string *)in_RSI);
  }
  else {
    this = in_RSI;
    cleanup = in_RSI;
    n_00 = in_RDI;
    this_00 = in_RSI;
    AlignUpTo8(0x20);
    ArenaImpl::RecordAlloc(this,in_stack_ffffffffffffff58,in_RDI);
    local_40 = (string *)
               ArenaImpl::AllocateAlignedAndAddCleanup(this_00,n_00,(_func_void_void_ptr *)cleanup);
    std::__cxx11::string::string((string *)local_40,(string *)in_RSI);
  }
  return local_40;
}

Assistant:

static inline std::string* New(Arena* arena, std::string&& value) {
    return Arena::Create<std::string>(arena, std::move(value));
  }